

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void objectAdder(String key,Data value,void *arg1,void *arg2)

{
  Data data;
  fy_node *fyn_key;
  fy_node *fyn_value;
  
  data = newDataString(key);
  fyn_key = encodeYamlString((fy_document *)arg2,data);
  fyn_value = encodeYaml((fy_document *)arg2,value);
  fy_node_mapping_append((fy_node *)arg1,fyn_key,fyn_value);
  shallowFreeData(data);
  return;
}

Assistant:

static void objectAdder(String key, Data value, void *arg1, void *arg2) {
    struct fy_node *obj = arg1;
    struct fy_document *doc = arg2;
    Data str = newDataString(key);
    fy_node_mapping_append(obj, encodeYamlString(doc, str),
                           encodeYaml(doc, value));
    shallowFreeData(str);
}